

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall VariationalBayesEstimatorOnLDA::calculateEx(VariationalBayesEstimatorOnLDA *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  reference pvVar5;
  reference pvVar6;
  uint local_20;
  uint local_1c;
  int v;
  int k_1;
  int k;
  int d;
  VariationalBayesEstimatorOnLDA *this_local;
  
  for (k_1 = 0; (uint)k_1 < this->_D; k_1 = k_1 + 1) {
    for (v = 0; (uint)v < this->_K; v = v + 1) {
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_ndk,(long)k_1);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)v);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->_alpha,(long)v);
      dVar2 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->_nd,(long)k_1);
      dVar3 = *pvVar6;
      dVar4 = this->_alphaSum;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_thetaEx,(long)k_1);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)v);
      *pvVar6 = (dVar1 + dVar2) / (dVar3 + dVar4);
    }
  }
  for (local_1c = 0; local_1c < this->_K; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < this->_V; local_20 = local_20 + 1) {
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_nkv,(long)(int)local_1c);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)(int)local_20);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_beta,(long)(int)local_20);
      dVar2 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_nk,(long)(int)local_1c);
      dVar3 = *pvVar6;
      dVar4 = this->_betaSum;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->_phiEx,(long)(int)local_1c);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)(int)local_20);
      *pvVar6 = (dVar1 + dVar2) / (dVar3 + dVar4);
    }
  }
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::calculateEx(){//{{{
    for(int d=0;d<_D;d++){
        for(int k=0;k<_K;k++){
            _thetaEx[d][k]=(_ndk[d][k]+_alpha[k])/(_nd[d]+_alphaSum);
        }
    }
    for(int k=0;k<_K;k++){
        for(int v=0;v<_V;v++){
            _phiEx[k][v]=(_nkv[k][v]+_beta[v])/(_nk[k]+_betaSum);
        }
    }

}